

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void slang::ast::enforceNondegeneracy
               (AssertionExpr *expr,ASTContext *context,NondegeneracyRequirement nondegRequirement,
               SyntaxNode *syntax)

{
  SourceRange sourceRange;
  SourceRange range_00;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  int in_EDX;
  SourceRange SVar2;
  Diagnostic *diag;
  SourceRange range;
  bitmask<slang::ast::NondegeneracyStatus> seqNondegenSt;
  NondegeneracyCheckResult seqNondegen;
  bitmask<slang::ast::NondegeneracyStatus> *in_stack_fffffffffffffef8;
  AssertionExpr *in_stack_ffffffffffffff00;
  Diagnostic *local_f0;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar3;
  bitmask<slang::ast::NondegeneracyStatus> in_stack_ffffffffffffff24;
  SourceLocation in_stack_ffffffffffffff28;
  DiagCode in_stack_ffffffffffffff34;
  bitmask<slang::ast::NondegeneracyStatus> local_c4;
  SourceLocation local_c0;
  SourceLocation local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  SourceLocation local_70;
  SourceLocation local_68;
  SourceRange local_58;
  bitmask<slang::ast::NondegeneracyStatus> local_48;
  undefined4 local_44;
  undefined4 local_40;
  SourceLocation local_38;
  SourceLocation local_30;
  byte local_28;
  int local_14;
  
  local_14 = in_EDX;
  AssertionExpr::checkNondegeneracy(in_stack_ffffffffffffff00);
  local_44 = local_40;
  bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_48,AdmitsNoMatch);
  bVar1 = bitmask<slang::ast::NondegeneracyStatus>::has
                    ((bitmask<slang::ast::NondegeneracyStatus> *)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8);
  if (bVar1) {
    local_58.startLoc = local_38;
    local_58.endLoc = local_30;
    SourceRange::start(&local_58);
    bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x7d06bb);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      SVar2 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                        );
      local_70 = SVar2.startLoc;
      local_58.startLoc = local_70;
      local_68 = SVar2.endLoc;
      local_58.endLoc = local_68;
    }
    if ((local_28 & 1) == 0) {
      local_c0 = local_58.startLoc;
      local_b8 = local_58.endLoc;
      SVar2.startLoc._4_4_ = in_stack_ffffffffffffff24.m_bits;
      SVar2.startLoc._0_4_ = in_stack_ffffffffffffff20;
      SVar2.endLoc = in_stack_ffffffffffffff28;
      ASTContext::addDiag((ASTContext *)local_f0,in_stack_ffffffffffffff34,SVar2);
    }
    else {
      slang::syntax::SyntaxNode::sourceRange
                ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff24.m_bits;
      sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff20;
      sourceRange.endLoc = in_stack_ffffffffffffff28;
      ASTContext::addDiag((ASTContext *)local_f0,in_stack_ffffffffffffff34,sourceRange);
      range_00.startLoc._4_4_ = in_stack_ffffffffffffff24.m_bits;
      range_00.startLoc._0_4_ = in_stack_ffffffffffffff20;
      range_00.endLoc = in_stack_ffffffffffffff28;
      Diagnostic::addNote(local_f0,in_stack_ffffffffffffff34,range_00);
    }
  }
  else if (local_14 == 1) {
    bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_c4,AcceptsOnlyEmpty);
    bVar1 = bitmask<slang::ast::NondegeneracyStatus>::has
                      ((bitmask<slang::ast::NondegeneracyStatus> *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffef8);
    if (bVar1) {
      SVar2 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                        );
      sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff24.m_bits;
      sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff20;
      sourceRange_00.endLoc = SVar2.startLoc;
      ASTContext::addDiag((ASTContext *)local_f0,SVar2.endLoc._4_4_,sourceRange_00);
    }
  }
  else if (local_14 != 2) {
    bitmask<slang::ast::NondegeneracyStatus>::bitmask
              ((bitmask<slang::ast::NondegeneracyStatus> *)&stack0xffffffffffffff24,AdmitsEmpty);
    bVar1 = bitmask<slang::ast::NondegeneracyStatus>::has
                      ((bitmask<slang::ast::NondegeneracyStatus> *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffef8);
    if (bVar1) {
      uVar3 = 0x430008;
      SVar2 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                        );
      sourceRange_01.startLoc._4_4_ = in_stack_ffffffffffffff24.m_bits;
      sourceRange_01.startLoc._0_4_ = uVar3;
      sourceRange_01.endLoc = in_stack_ffffffffffffff28;
      ASTContext::addDiag((ASTContext *)SVar2.endLoc,in_stack_ffffffffffffff34,sourceRange_01);
    }
  }
  return;
}

Assistant:

static void enforceNondegeneracy(const AssertionExpr& expr, const ASTContext& context,
                                 AssertionExpr::NondegeneracyRequirement nondegRequirement,
                                 const SyntaxNode& syntax) {
    using NR = AssertionExpr::NondegeneracyRequirement;
    const auto seqNondegen = expr.checkNondegeneracy();
    const auto seqNondegenSt = seqNondegen.status;
    if (seqNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch)) {
        auto range = seqNondegen.noMatchRange;
        if (!range.start())
            range = syntax.sourceRange();

        if (seqNondegen.isAlwaysFalse) {
            auto& diag = context.addDiag(diag::SeqNoMatch, syntax.sourceRange());
            diag.addNote(diag::NoteAlwaysFalse, range);
        }
        else {
            context.addDiag(diag::SeqNoMatch, range);
        }
    }
    else if (nondegRequirement == NR::OverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AcceptsOnlyEmpty))
            context.addDiag(diag::SeqOnlyEmpty, syntax.sourceRange());
    }
    else if (nondegRequirement != NR::NonOverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AdmitsEmpty))
            context.addDiag(diag::SeqEmptyMatch, syntax.sourceRange());
    }
}